

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

void Abc_TtFlip(word *pTruth,int nWords,int iVar)

{
  word *pwVar1;
  word wVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  word *pwVar8;
  
  if (nWords != 1) {
    if (iVar < 6) {
      if (0 < nWords) {
        uVar4 = s_Truths6[iVar];
        uVar7 = 0;
        do {
          bVar3 = (byte)(1 << ((byte)iVar & 0x1f));
          pTruth[uVar7] =
               (uVar4 & pTruth[uVar7]) >> (bVar3 & 0x3f) | pTruth[uVar7] << (bVar3 & 0x3f) & uVar4;
          uVar7 = uVar7 + 1;
        } while ((uint)nWords != uVar7);
      }
    }
    else if (0 < nWords) {
      pwVar1 = pTruth + nWords;
      bVar3 = (byte)(iVar + -6);
      uVar6 = 1 << (bVar3 & 0x1f);
      iVar5 = 2 << (bVar3 & 0x1f);
      uVar4 = 1;
      if (1 < (int)uVar6) {
        uVar4 = (ulong)uVar6;
      }
      pwVar8 = pTruth + (int)uVar6;
      do {
        if (iVar + -6 != 0x1f) {
          uVar7 = 0;
          do {
            wVar2 = pTruth[uVar7];
            pTruth[uVar7] = pwVar8[uVar7];
            pwVar8[uVar7] = wVar2;
            uVar7 = uVar7 + 1;
          } while (uVar4 != uVar7);
        }
        pTruth = pTruth + iVar5;
        pwVar8 = pwVar8 + iVar5;
      } while (pTruth < pwVar1);
    }
    return;
  }
  bVar3 = (byte)(1 << ((byte)iVar & 0x1f));
  *pTruth = (s_Truths6[iVar] & *pTruth) >> (bVar3 & 0x3f) |
            *pTruth << (bVar3 & 0x3f) & s_Truths6[iVar];
  return;
}

Assistant:

static inline void Abc_TtFlip( word * pTruth, int nWords, int iVar )
{
    if ( nWords == 1 )
        pTruth[0] = ((pTruth[0] << (1 << iVar)) & s_Truths6[iVar]) | ((pTruth[0] & s_Truths6[iVar]) >> (1 << iVar));
	else if ( iVar <= 5 )
	{
		int w, shift = (1 << iVar);
		for ( w = 0; w < nWords; w++ )
            pTruth[w] = ((pTruth[w] << shift) & s_Truths6[iVar]) | ((pTruth[w] & s_Truths6[iVar]) >> shift);
	}
	else // if ( iVar > 5 )
	{
        word * pLimit = pTruth + nWords;
		int i, iStep = Abc_TtWordNum(iVar);
		for ( ; pTruth < pLimit; pTruth += 2*iStep )
			for ( i = 0; i < iStep; i++ )
                ABC_SWAP( word, pTruth[i], pTruth[i + iStep] );
	}	
}